

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_indexed(FuncState *fs,expdesc *t,expdesc *k)

{
  int iVar1;
  expkind eVar2;
  TValue *io;
  Value local_28;
  byte local_20;
  
  if (k->k == VKSTR) {
    local_28 = (Value)(k->u).strval;
    local_20 = (local_28.gc)->tt | 0x40;
    iVar1 = k2proto(fs,(TValue *)&local_28,(TValue *)&local_28);
    (k->u).info = iVar1;
    k->k = VK;
  }
  if ((t->k == VUPVAL) &&
     ((((k->k != VK || (k->t != k->f)) || (0xff < (long)(k->u).info)) ||
      (fs->f->k[(k->u).info].tt_ != 'D')))) {
    luaK_exp2anyreg(fs,t);
  }
  if ((t->k == VLOCAL) || (t->k != VUPVAL)) {
    (t->u).ind.t = (t->u).var.ridx;
    if (k->k == VKINT) {
      if ((k->t == k->f) && ((k->u).strval < (TString *)0x100)) {
        (t->u).ind.idx = (k->u).ind.idx;
        eVar2 = VINDEXI;
        goto LAB_00124cec;
      }
    }
    else if ((((k->k == VK) && (k->t == k->f)) && ((long)(k->u).info < 0x100)) &&
            (fs->f->k[(k->u).info].tt_ == 'D')) {
      (t->u).ind.idx = (k->u).ind.idx;
      eVar2 = VINDEXSTR;
      goto LAB_00124cec;
    }
    iVar1 = luaK_exp2anyreg(fs,k);
    (t->u).ind.idx = (short)iVar1;
    eVar2 = VINDEXED;
  }
  else {
    (t->u).ind.t = (t->u).var.ridx;
    (t->u).ind.idx = (k->u).ind.idx;
    eVar2 = VINDEXUP;
  }
LAB_00124cec:
  t->k = eVar2;
  return;
}

Assistant:

void luaK_indexed (FuncState *fs, expdesc *t, expdesc *k) {
  if (k->k == VKSTR)
    str2K(fs, k);
  lua_assert(!hasjumps(t) &&
             (t->k == VLOCAL || t->k == VNONRELOC || t->k == VUPVAL));
  if (t->k == VUPVAL && !isKstr(fs, k))  /* upvalue indexed by non 'Kstr'? */
    luaK_exp2anyreg(fs, t);  /* put it in a register */
  if (t->k == VUPVAL) {
    lu_byte temp = cast_byte(t->u.info);  /* upvalue index */
    lua_assert(isKstr(fs, k));
    t->u.ind.t = temp;  /* (can't do a direct assignment; values overlap) */
    t->u.ind.idx = cast(short, k->u.info);  /* literal short string */
    t->k = VINDEXUP;
  }
  else {
    /* register index of the table */
    t->u.ind.t = cast_byte((t->k == VLOCAL) ? t->u.var.ridx: t->u.info);
    if (isKstr(fs, k)) {
      t->u.ind.idx = cast(short, k->u.info);  /* literal short string */
      t->k = VINDEXSTR;
    }
    else if (isCint(k)) {  /* int. constant in proper range? */
      t->u.ind.idx = cast(short, k->u.ival);
      t->k = VINDEXI;
    }
    else {
      t->u.ind.idx = cast(short, luaK_exp2anyreg(fs, k));  /* register */
      t->k = VINDEXED;
    }
  }
}